

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O0

_Bool insert(VarHTItem **bucket,VarHTItemKey key,VarHTItem *new_item)

{
  var_table_item_t *pvVar1;
  VarHTItem *pVVar2;
  undefined8 uVar3;
  _Bool _Var4;
  VarHTItem *next_1;
  VarHTItem **current;
  VarHTItem *previous;
  VarHTItem *next;
  VarHTItem *new_item_local;
  VarHTItem **bucket_local;
  VarHTItemKey key_local;
  
  _Var4 = equals((*bucket)->key,key);
  if (_Var4) {
    pvVar1 = (*bucket)->next;
    free(*bucket);
    *bucket = new_item;
    (*bucket)->next = pvVar1;
    key_local.ident_length._7_1_ = true;
  }
  else {
    current = (VarHTItem **)*bucket;
    pVVar2 = *bucket;
    while (next_1 = (VarHTItem *)&pVVar2->next, (next_1->key).key_ident_string != (char *)0x0) {
      _Var4 = equals(*(VarHTItemKey *)(next_1->key).key_ident_string,key);
      if (_Var4) {
        uVar3 = *(undefined8 *)((next_1->key).key_ident_string + 0x20);
        free((next_1->key).key_ident_string);
        (next_1->key).key_ident_string = (char *)new_item;
        *(undefined8 *)((next_1->key).key_ident_string + 0x20) = uVar3;
        return true;
      }
      current = (VarHTItem **)(next_1->key).key_ident_string;
      pVVar2 = (VarHTItem *)(next_1->key).key_ident_string;
    }
    current[4] = new_item;
    key_local.ident_length._7_1_ = false;
  }
  return key_local.ident_length._7_1_;
}

Assistant:

static bool insert(VarHTItem **bucket, VarHTItemKey key, VarHTItem *new_item) {
    if (equals((*bucket)->key, key)) {
        VarHTItem *next = (*bucket)->next;
        free(*bucket);
        *bucket = new_item;
        (*bucket)->next = next;
        return true;
    }

    VarHTItem *previous = *bucket;
    VarHTItem **current = &(*bucket)->next;

    while (*current) {
        if (equals((*current)->key, key)) {
            VarHTItem *next = (*current)->next;
            free(*current);
            *current = new_item;
            (*current)->next = next;
            return true;
        }

        previous = *current;
        current = &(*current)->next;
    }

    previous->next = new_item;
    return false;
}